

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
* __thiscall hanabi_learning_env::HanabiState::ChanceOutcomes(HanabiState *this)

{
  HanabiMove move_00;
  bool bVar1;
  int iVar2;
  HanabiGame *this_00;
  HanabiMove HVar3;
  HanabiState *in_RSI;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  *in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  undefined4 unaff_retaddr;
  HanabiMove move;
  int uid;
  int max_outcome_uid;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  *rv;
  HanabiGame *in_stack_ffffffffffffff68;
  HanabiGame *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  Type in_stack_ffffffffffffff90;
  int iVar4;
  int local_28;
  HanabiState *this_02;
  Type TVar5;
  
  TVar5 = (Type)((ulong)in_RDI >> 0x20);
  this_02 = in_RSI;
  std::
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  ::
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>,_true>
            ((pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
              *)in_stack_ffffffffffffff70);
  ParentGame(in_RSI);
  iVar2 = HanabiGame::MaxChanceOutcomes(in_stack_ffffffffffffff70);
  iVar4 = iVar2;
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    this_00 = ParentGame(in_RSI);
    HVar3 = HanabiGame::GetChanceOutcome(in_stack_ffffffffffffff68,0);
    move_00._4_4_ = unaff_retaddr;
    move_00.move_type_ = TVar5;
    bVar1 = MoveIsLegal(this_02,move_00);
    if (bVar1) {
      std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::push_back((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                   *)HVar3,(value_type *)CONCAT17(bVar1,in_stack_ffffffffffffff78));
      in_stack_ffffffffffffff68 = (HanabiGame *)&in_RDI->second;
      HVar3.card_index_ = (char)iVar4;
      HVar3.target_offset_ = (char)((uint)iVar4 >> 8);
      HVar3.color_ = (char)((uint)iVar4 >> 0x10);
      HVar3.rank_ = (char)((uint)iVar4 >> 0x18);
      HVar3.move_type_ = in_stack_ffffffffffffff90;
      this_01 = (vector<double,_std::allocator<double>_> *)
                ChanceOutcomeProb((HanabiState *)this_00,HVar3);
      std::vector<double,_std::allocator<double>_>::push_back
                (this_01,(value_type_conflict1 *)in_stack_ffffffffffffff68);
    }
  }
  return in_RDI;
}

Assistant:

std::pair<std::vector<HanabiMove>, std::vector<double>>
HanabiState::ChanceOutcomes() const {
  std::pair<std::vector<HanabiMove>, std::vector<double>> rv;
  int max_outcome_uid = ParentGame()->MaxChanceOutcomes();
  for (int uid = 0; uid < max_outcome_uid; ++uid) {
    HanabiMove move = ParentGame()->GetChanceOutcome(uid);
    if (MoveIsLegal(move)) {
      rv.first.push_back(move);
      rv.second.push_back(ChanceOutcomeProb(move));
    }
  }
  return rv;
}